

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O3

void Image_Function::Histogram
               (Image *image,uint32_t x,uint32_t y,Image *mask,uint32_t maskX,uint32_t maskY,
               uint32_t width,uint32_t height,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *histogram)

{
  uint uVar1;
  uint uVar2;
  pointer __s;
  pointer puVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar4;
  uchar *puVar5;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  uchar *puVar6;
  uchar *puVar7;
  ulong uVar8;
  ImageTemplate<unsigned_char> local_80;
  ImageTemplate<unsigned_char> local_58;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (image,x,y,mask,maskX,maskY,width,height);
  local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_001febe8;
  local_80._data = (uchar *)0x0;
  local_80._type = mask->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_80,(EVP_PKEY_CTX *)mask,src);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(image);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(&local_80);
  local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_001febe8;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_80);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_001febe8;
  local_58._data = (uchar *)0x0;
  local_58._type = mask->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_58,(EVP_PKEY_CTX *)mask,src_00);
  OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (&width,&height,image,&local_58);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_001febe8;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
  pvVar4 = histogram;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(histogram,0x100);
  __s = (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_start;
  puVar3 = (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (__s != puVar3) {
    memset(__s,0,((long)puVar3 + (-4 - (long)__s) & 0xfffffffffffffffcU) + 4);
  }
  uVar1 = image->_rowSize;
  if (height * uVar1 != 0) {
    uVar2 = mask->_rowSize;
    puVar6 = image->_data + (ulong)x + (ulong)(y * uVar1);
    puVar5 = puVar6 + height * uVar1;
    puVar7 = mask->_data + (ulong)maskX + (ulong)(maskY * uVar2);
    do {
      if ((ulong)width != 0) {
        uVar8 = 0;
        do {
          if (puVar7[uVar8] != '\0') {
            __s[puVar6[uVar8]] = __s[puVar6[uVar8]] + 1;
          }
          uVar8 = uVar8 + 1;
        } while (width != uVar8);
      }
      puVar6 = puVar6 + uVar1;
      puVar7 = puVar7 + uVar2;
    } while (puVar6 != puVar5);
  }
  return;
}

Assistant:

void Histogram( const Image & image, uint32_t x, uint32_t y, const Image & mask, uint32_t maskX, uint32_t maskY, uint32_t width, uint32_t height,
                    std::vector < uint32_t > & histogram )
    {
        ParameterValidation( image, x, y, mask, maskX, maskY, width, height );
        VerifyGrayScaleImage( image, mask );
        OptimiseRoi( width, height, image, mask );

        histogram.resize( 256u );
        std::fill( histogram.begin(), histogram.end(), 0u );

        const uint32_t rowSize     = image.rowSize();
        const uint32_t rowSizeMask = mask.rowSize();

        const uint8_t * imageY     = image.data() + y * rowSize + x;
        const uint8_t * imageYMask = mask.data() + maskY * rowSizeMask + maskX;
        const uint8_t * imageYEnd  = imageY + height * rowSize;

        for( ; imageY != imageYEnd; imageY += rowSize, imageYMask += rowSizeMask ) {
            const uint8_t * imageX     = imageY;
            const uint8_t * imageXMask = imageYMask;
            const uint8_t * imageXEnd  = imageX + width;

            for( ; imageX != imageXEnd; ++imageX, ++imageXMask ) {
                if( (*imageXMask) > 0 )
                    ++histogram[*imageX];
            }
        }
    }